

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

void crypto::xchacha20::init_state(word *state,char *key)

{
  uint uVar1;
  undefined4 *in_RDI;
  size_t i;
  char *buffer;
  
  *in_RDI = 0x61707865;
  in_RDI[1] = 0x3320646e;
  in_RDI[2] = 0x79622d32;
  in_RDI[3] = 0x6b206574;
  for (buffer = (char *)0x0; buffer < (char *)0x8; buffer = buffer + 1) {
    uVar1 = util::endianness<util::little_endian>::load<unsigned_int>(buffer);
    in_RDI[(long)(buffer + 4)] = uVar1;
  }
  return;
}

Assistant:

void xchacha20::init_state(word state[16], const char key[key_size]) {
	
	state[0] = 0x61707865;
	state[1] = 0x3320646e;
	state[2] = 0x79622d32;
	state[3] = 0x6b206574;
	for(size_t i = 0; i < 8; i++) {
		state[4 + i] = util::little_endian::load<word>(key + i * sizeof(word));
	}
	
}